

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::SafeToCopyPropInPrepass(GlobOpt *this,StackSym *originalSym,StackSym *copySym,Value *value)

{
  ValueInfo *srcValueInfo;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  StackSym *pSVar4;
  undefined4 *puVar5;
  
  pSVar4 = GlobOptBlockData::GetCopyPropSym
                     (&this->currentBlock->globOptData,&originalSym->super_Sym,value);
  if (pSVar4 != copySym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x166d,
                       "(this->currentBlock->globOptData.GetCopyPropSym(originalSym, value) == copySym)"
                       ,
                       "this->currentBlock->globOptData.GetCopyPropSym(originalSym, value) == copySym"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  srcValueInfo = value->valueInfo;
  bVar2 = IsSafeToTransferInPrepass(this,originalSym,srcValueInfo);
  if ((bVar2) && (bVar2 = IsSafeToTransferInPrepass(this,copySym,srcValueInfo), bVar2)) {
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((this->currentBlock->loop->regAlloc).liveOnBackEdgeSyms,
                       (originalSym->super_Sym).m_id);
    if (BVar3 != '\0') {
      bVar2 = Loop::IsSymAssignedToInSelfOrParents(this->currentBlock->loop,copySym);
      return !bVar2;
    }
    return true;
  }
  return false;
}

Assistant:

bool
GlobOpt::SafeToCopyPropInPrepass(StackSym * const originalSym, StackSym * const copySym, Value *const value) const
{
    Assert(this->currentBlock->globOptData.GetCopyPropSym(originalSym, value) == copySym);

    // In the following example, to copy-prop s2 into s1, it is not enough to check if s1 and s2 are safe to transfer.
    // In fact, both s1 and s2 are safe to transfer, but it is not legal to copy prop s2 into s1. 
    //
    // s1 = s2
    // $Loop:
    //   s3 = s1
    //   s2 = s4
    //   Br $Loop
    //
    // In general, requirements for copy-propping in prepass are more restricted than those for transferring values.
    // For copy prop in prepass, if the original sym is live on back-edge, then the copy-prop sym should not be written to
    // in the loop (or its parents)
    
    ValueInfo* const valueInfo = value->GetValueInfo();
    return IsSafeToTransferInPrepass(originalSym, valueInfo) &&
        IsSafeToTransferInPrepass(copySym, valueInfo) &&
        (!currentBlock->loop->regAlloc.liveOnBackEdgeSyms->Test(originalSym->m_id) || !currentBlock->loop->IsSymAssignedToInSelfOrParents(copySym));
}